

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_augment(lys_node_augment *aug,lys_node *uses,unres_schema *unres)

{
  ly_ctx *ctx_00;
  unres_schema *start_parent;
  lys_node *elem;
  int iVar1;
  lys_module *plVar2;
  lys_module *plVar3;
  char *pcVar4;
  char *pcVar5;
  lys_module *local_68;
  ly_ctx *ctx;
  ly_set *set;
  lys_module *mod;
  lys_node *sub;
  unres_schema *puStack_28;
  int rc;
  unres_schema *unres_local;
  lys_node *uses_local;
  lys_node_augment *aug_local;
  
  puStack_28 = unres;
  unres_local = (unres_schema *)uses;
  uses_local = (lys_node *)aug;
  if (aug == (lys_node_augment *)0x0) {
    __assert_fail("aug",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x1299,
                  "int resolve_augment(struct lys_node_augment *, struct lys_node *, struct unres_schema *)"
                 );
  }
  set = (ly_set *)lys_main_module(aug->module);
  start_parent = unres_local;
  ctx_00 = ((lys_module *)set)->ctx;
  uses_local->flags = uses_local->flags | 1;
  if (uses_local->prev == (lys_node *)0x0) {
    pcVar4 = uses_local->name;
    if (unres_local == (unres_schema *)0x0) {
      local_68 = lys_node_module(uses_local);
    }
    else {
      local_68 = (lys_module *)0x0;
    }
    sub._4_4_ = resolve_schema_nodeid(pcVar4,(lys_node *)start_parent,local_68,(ly_set **)&ctx,0,0);
    if (sub._4_4_ == -1) {
      ly_vlog(ctx_00,LYE_PATH,LY_VLOG_LYS,uses_local);
      return -1;
    }
    if (ctx == (ly_ctx *)0x0) {
      ly_vlog(ctx_00,LYE_INRESOLV,LY_VLOG_LYS,uses_local,"augment",uses_local->name);
      return 1;
    }
    uses_local->prev = (lys_node *)**(undefined8 **)&(ctx->dict).lock;
    ly_set_free((ly_set *)ctx);
  }
  if ((((ushort)set[4].size >> 7 & 1) != 0) &&
     (plVar2 = lys_node_module(uses_local->prev), (*(ushort *)&plVar2->field_0x40 >> 7 & 1) == 0)) {
    plVar2 = lys_node_module(uses_local->prev);
    *(ushort *)&plVar2->field_0x40 = *(ushort *)&plVar2->field_0x40 & 0xff7f | 0x80;
    plVar2 = lys_node_module(uses_local->prev);
    iVar1 = unres_schema_add_node(plVar2,puStack_28,(void *)0x0,UNRES_MOD_IMPLEMENT,(lys_node *)0x0)
    ;
    if (iVar1 == -1) {
      return -1;
    }
  }
  if (uses_local->parent == (lys_node *)0x0) {
    plVar2 = lys_node_module(uses_local);
    plVar3 = lys_node_module(uses_local->prev);
    if ((plVar2 != plVar3) &&
       (sub._4_4_ = lyp_check_mandatory_augment((lys_node_augment *)uses_local,uses_local->prev),
       sub._4_4_ != 0)) {
      return sub._4_4_;
    }
  }
  elem = uses_local;
  if ((uses_local->prev->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) {
    if ((uses_local->prev->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_CASE)) == LYS_UNKNOWN) {
      if (uses_local->prev->nodetype != LYS_CHOICE) {
        ly_vlog(ctx_00,LYE_INARG,LY_VLOG_LYS,uses_local,uses_local->name,"target-node");
        pcVar4 = strnodetype(uses_local->prev->nodetype);
        ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Invalid augment target node type \"%s\".",
                pcVar4);
        return -1;
      }
      for (mod = (lys_module *)uses_local->child; mod != (lys_module *)0x0;
          mod = *(lys_module **)&mod->ext_size) {
        if (((ulong)mod->filepath & 0x807d) == 0) {
          pcVar4 = strnodetype(*(LYS_NODE *)&mod->filepath);
          ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,elem,pcVar4,"augment");
          pcVar4 = strnodetype(uses_local->prev->nodetype);
          pcVar5 = strnodetype(*(LYS_NODE *)&mod->filepath);
          ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Cannot augment \"%s\" with a \"%s\".",
                  pcVar4,pcVar5);
          return -1;
        }
      }
    }
    else {
      for (mod = (lys_module *)uses_local->child; mod != (lys_module *)0x0;
          mod = *(lys_module **)&mod->ext_size) {
        if (((ulong)mod->filepath & 0x903f) == 0) {
          pcVar4 = strnodetype(*(LYS_NODE *)&mod->filepath);
          ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,elem,pcVar4,"augment");
          pcVar4 = strnodetype(uses_local->prev->nodetype);
          pcVar5 = strnodetype(*(LYS_NODE *)&mod->filepath);
          ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Cannot augment \"%s\" with a \"%s\".",
                  pcVar4,pcVar5);
          return -1;
        }
      }
    }
  }
  else {
    for (mod = (lys_module *)uses_local->child; mod != (lys_module *)0x0;
        mod = *(lys_module **)&mod->ext_size) {
      if (((ulong)mod->filepath & 0xd0bf) == 0) {
        pcVar4 = strnodetype(*(LYS_NODE *)&mod->filepath);
        ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,elem,pcVar4,"augment");
        pcVar4 = strnodetype(uses_local->prev->nodetype);
        pcVar5 = strnodetype(*(LYS_NODE *)&mod->filepath);
        ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,"Cannot augment \"%s\" with a \"%s\".",
                pcVar4,pcVar5);
        return -1;
      }
    }
  }
  for (mod = (lys_module *)uses_local->child; mod != (lys_module *)0x0;
      mod = *(lys_module **)&mod->ext_size) {
    iVar1 = lys_check_id((lys_node *)mod,uses_local->prev,(lys_module *)0x0);
    if (iVar1 != 0) {
      return -1;
    }
  }
  if (uses_local->child == (lys_node *)0x0) {
    ly_log(ctx_00,LY_LLWRN,LY_SUCCESS,"Augment \"%s\" without children.",uses_local->name);
    uses_local->flags = uses_local->flags & 0xfffe;
  }
  else if (((uses_local->parent != (lys_node *)0x0) || (((ushort)set[4].size >> 7 & 1) != 0)) &&
          (iVar1 = apply_aug((lys_node_augment *)uses_local,puStack_28), iVar1 != 0)) {
    return -1;
  }
  return 0;
}

Assistant:

static int
resolve_augment(struct lys_node_augment *aug, struct lys_node *uses, struct unres_schema *unres)
{
    int rc;
    struct lys_node *sub;
    struct lys_module *mod;
    struct ly_set *set;
    struct ly_ctx *ctx;

    assert(aug);
    mod = lys_main_module(aug->module);
    ctx = mod->ctx;

    /* set it as not applied for now */
    aug->flags |= LYS_NOTAPPLIED;

    /* it can already be resolved in case we returned EXIT_FAILURE from if block below */
    if (!aug->target) {
        /* resolve target node */
        rc = resolve_schema_nodeid(aug->target_name, uses, (uses ? NULL : lys_node_module((struct lys_node *)aug)), &set, 0, 0);
        if (rc == -1) {
            LOGVAL(ctx, LYE_PATH, LY_VLOG_LYS, aug);
            return -1;
        }
        if (!set) {
            LOGVAL(ctx, LYE_INRESOLV, LY_VLOG_LYS, aug, "augment", aug->target_name);
            return EXIT_FAILURE;
        }
        aug->target = set->set.s[0];
        ly_set_free(set);
    }

    /* make this module implemented if the target module is (if the target is in an unimplemented module,
     * it is fine because when we will be making that module implemented, its augment will be applied
     * and that augment target module made implemented, recursively) */
    if (mod->implemented && !lys_node_module(aug->target)->implemented) {
        lys_node_module(aug->target)->implemented = 1;
        if (unres_schema_add_node(lys_node_module(aug->target), unres, NULL, UNRES_MOD_IMPLEMENT, NULL) == -1) {
            return -1;
        }
    }

    /* check for mandatory nodes - if the target node is in another module
     * the added nodes cannot be mandatory
     */
    if (!aug->parent && (lys_node_module((struct lys_node *)aug) != lys_node_module(aug->target))
            && (rc = lyp_check_mandatory_augment(aug, aug->target))) {
        return rc;
    }

    /* check augment target type and then augment nodes type */
    if (aug->target->nodetype & (LYS_CONTAINER | LYS_LIST)) {
        LY_TREE_FOR(aug->child, sub) {
            if (!(sub->nodetype & (LYS_ANYDATA | LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_USES
                                   | LYS_CHOICE | LYS_ACTION | LYS_NOTIF))) {
                LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, aug, strnodetype(sub->nodetype), "augment");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Cannot augment \"%s\" with a \"%s\".",
                       strnodetype(aug->target->nodetype), strnodetype(sub->nodetype));
                return -1;
            }
        }
    } else if (aug->target->nodetype & (LYS_CASE | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF)) {
        LY_TREE_FOR(aug->child, sub) {
            if (!(sub->nodetype & (LYS_ANYDATA | LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_USES | LYS_CHOICE))) {
                LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, aug, strnodetype(sub->nodetype), "augment");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Cannot augment \"%s\" with a \"%s\".",
                       strnodetype(aug->target->nodetype), strnodetype(sub->nodetype));
                return -1;
            }
        }
    } else if (aug->target->nodetype == LYS_CHOICE) {
        LY_TREE_FOR(aug->child, sub) {
            if (!(sub->nodetype & (LYS_CASE | LYS_ANYDATA | LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST))) {
                LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, aug, strnodetype(sub->nodetype), "augment");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Cannot augment \"%s\" with a \"%s\".",
                       strnodetype(aug->target->nodetype), strnodetype(sub->nodetype));
                return -1;
            }
        }
    } else {
        LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, aug, aug->target_name, "target-node");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid augment target node type \"%s\".", strnodetype(aug->target->nodetype));
        return -1;
    }

    /* check identifier uniqueness as in lys_node_addchild() */
    LY_TREE_FOR(aug->child, sub) {
        if (lys_check_id(sub, aug->target, NULL)) {
            return -1;
        }
    }

    if (!aug->child) {
        /* empty augment, nothing to connect, but it is techincally applied */
        LOGWRN(ctx, "Augment \"%s\" without children.", aug->target_name);
        aug->flags &= ~LYS_NOTAPPLIED;
    } else if ((aug->parent || mod->implemented) && apply_aug(aug, unres)) {
        /* we try to connect the augment only in case the module is implemented or
         * the augment applies on the used grouping, anyway we failed here */
        return -1;
    }

    return EXIT_SUCCESS;
}